

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

Upvaldesc * allocupvalue(FuncState *fs)

{
  byte bVar1;
  int iVar2;
  Proto *pPVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Upvaldesc *pUVar6;
  long lVar7;
  long lVar8;
  Upvaldesc *pUVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (fs->nups != 0xff) {
    pPVar3 = fs->f;
    iVar2 = pPVar3->sizeupvalues;
    pUVar6 = (Upvaldesc *)
             luaM_growaux_(fs->ls->L,pPVar3->upvalues,(uint)fs->nups,&pPVar3->sizeupvalues,0x10,0xff
                           ,"upvalues");
    pPVar3->upvalues = pUVar6;
    auVar5 = _DAT_0012b780;
    auVar4 = _DAT_0012b770;
    if (iVar2 < pPVar3->sizeupvalues) {
      lVar7 = (long)pPVar3->sizeupvalues - (long)iVar2;
      lVar8 = lVar7 + -1;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      pUVar9 = pUVar6 + (long)iVar2 + 1;
      uVar10 = 0;
      auVar11 = auVar11 ^ _DAT_0012b780;
      do {
        auVar12._8_4_ = (int)uVar10;
        auVar12._0_8_ = uVar10;
        auVar12._12_4_ = (int)(uVar10 >> 0x20);
        auVar12 = (auVar12 | auVar4) ^ auVar5;
        if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                    auVar11._4_4_ < auVar12._4_4_) & 1)) {
          pUVar9[-1].name = (TString *)0x0;
        }
        if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
            auVar12._12_4_ <= auVar11._12_4_) {
          pUVar9->name = (TString *)0x0;
        }
        uVar10 = uVar10 + 2;
        pUVar9 = pUVar9 + 2;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    bVar1 = fs->nups;
    fs->nups = bVar1 + 1;
    return pUVar6 + bVar1;
  }
  errorlimit(fs,0xff,"upvalues");
}

Assistant:

static Upvaldesc *allocupvalue (FuncState *fs) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  return &f->upvalues[fs->nups++];
}